

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O2

bool __thiscall Imath_3_2::Vec3<float>::equalWithAbsError(Vec3<float> *this,Vec3<float> *v,float e)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    if (uVar4 == 3) break;
    fVar1 = (&this->x)[uVar4];
    fVar2 = (&v->x)[uVar4];
    uVar3 = uVar4 + 1;
  } while ((float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                  (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1)) <= e);
  return 2 < uVar4;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Vec3<T>::equalWithAbsError (const Vec3<T>& v, T e) const IMATH_NOEXCEPT
{
    for (int i = 0; i < 3; i++)
        if (!IMATH_INTERNAL_NAMESPACE::equalWithAbsError ((*this)[i], v[i], e))
            return false;

    return true;
}